

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsCreateDataView(JsValueRef arrayBuffer,uint byteOffset,uint byteLength,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  JsrtContext *pJVar4;
  undefined4 *puVar5;
  RecyclableObject *value;
  ArrayBuffer *arrayBuffer_00;
  DataView *pDVar6;
  ScriptContext *__localScriptContext;
  JsErrorCode JVar7;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_60 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar4 = JsrtContext::GetCurrent();
  if (pJVar4 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  scriptContext = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  __enterScriptObject.library._0_4_ = byteLength;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_98 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_60,scriptContext,(ScriptEntryExitRecord *)auStack_98,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_60);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x895,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_0037b66a;
    *puVar5 = 0;
  }
  JVar7 = JsErrorInvalidArgument;
  if (arrayBuffer != (JsValueRef)0x0) {
    if ((ulong)arrayBuffer >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(arrayBuffer);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar7 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0037b38f;
        arrayBuffer = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (result == (JsValueRef *)0x0) {
      JVar7 = JsErrorNullArgument;
    }
    else {
      bVar3 = Js::VarIs<Js::ArrayBuffer>(arrayBuffer);
      JVar7 = JsErrorInvalidArgument;
      if (bVar3) {
        this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
        arrayBuffer_00 = Js::VarTo<Js::ArrayBuffer>(arrayBuffer);
        pDVar6 = Js::JavascriptLibrary::CreateDataView
                           (this,&arrayBuffer_00->super_ArrayBufferBase,byteOffset,
                            (uint)__enterScriptObject.library);
        *result = pDVar6;
        JVar7 = JsNoError;
      }
    }
  }
LAB_0037b38f:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_60);
  if ((JVar7 == JsErrorFatal) || (JVar7 == JsErrorNoCurrentContext)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
LAB_0037b66a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  return JVar7;
}

Assistant:

CHAKRA_API JsCreateDataView(_In_ JsValueRef arrayBuffer, _In_ unsigned int byteOffset, _In_ unsigned int byteLength, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_REFERENCE(arrayBuffer, scriptContext);
        PARAM_NOT_NULL(result);

        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptLibrary* library = scriptContext->GetLibrary();
        *result = library->CreateDataView(Js::VarTo<Js::ArrayBuffer>(arrayBuffer), byteOffset, byteLength);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(*result));
        return JsNoError;
    });
}